

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O3

void * tdefl_write_image_to_png_file_in_memory
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out)

{
  int6 iVar1;
  size_t *psVar2;
  int iVar3;
  tdefl_status tVar4;
  mz_bool mVar5;
  tdefl_compressor *d;
  size_t sVar6;
  mz_ulong mVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  tdefl_output_buffer out_buf;
  int local_9c;
  size_t local_98;
  byte bStack_90;
  byte bStack_8f;
  byte bStack_8e;
  byte bStack_8d;
  byte abStack_8c [13];
  uint uStack_7f;
  byte bStack_7b;
  undefined2 uStack_7a;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined4 uStack_73;
  int local_60;
  int local_5c;
  long local_58;
  ulong uStack_50;
  tdefl_compressor *local_48;
  undefined8 uStack_40;
  size_t *local_38;
  
  d = (tdefl_compressor *)crnlib::crnlib_malloc(0x4df78);
  *pLen_out = 0;
  if (d != (tdefl_compressor *)0x0) {
    iVar10 = num_chans * w;
    local_48 = (tdefl_compressor *)0x0;
    local_58 = 0;
    uStack_40 = 1;
    iVar3 = (iVar10 + 1) * h;
    iVar11 = 0x40;
    if (0x40 < iVar3) {
      iVar11 = iVar3;
    }
    uStack_50 = (ulong)(iVar11 + 0x39);
    local_60 = w;
    local_5c = num_chans;
    local_48 = (tdefl_compressor *)crnlib::crnlib_malloc(uStack_50);
    if (local_48 != (tdefl_compressor *)0x0) {
      local_9c = 0x29;
      iVar11 = 0x28;
      local_38 = pLen_out;
      do {
        iVar3 = iVar11;
        tdefl_output_buffer_putter(&local_9c,1,&local_58);
        iVar11 = iVar3 + -1;
        local_9c = iVar3;
      } while (iVar3 != 0);
      tdefl_init(d,tdefl_output_buffer_putter,&local_58,0x1080);
      if (0 < h) {
        uVar9 = (ulong)(uint)h;
        do {
          local_98 = 1;
          tdefl_compress(d,&local_9c,&local_98,(void *)0x0,(size_t *)0x0,TDEFL_NO_FLUSH);
          local_98 = (long)iVar10;
          tdefl_compress(d,pImage,&local_98,(void *)0x0,(size_t *)0x0,TDEFL_NO_FLUSH);
          pImage = (void *)((long)pImage + (long)iVar10);
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      local_98 = 0;
      tVar4 = tdefl_compress(d,(void *)0x0,&local_98,(void *)0x0,(size_t *)0x0,TDEFL_FINISH);
      psVar2 = local_38;
      if (tVar4 == TDEFL_STATUS_DONE) {
        sVar6 = local_58 - 0x29;
        *local_38 = sVar6;
        local_98 = 0xa1a0a0d474e5089;
        bStack_90 = 0;
        bStack_8f = 0;
        bStack_8e = 0;
        bStack_8d = 0xd;
        abStack_8c[0] = 0x49;
        abStack_8c[1] = 0x48;
        abStack_8c[2] = 0x44;
        abStack_8c[3] = 0x52;
        abStack_8c[4] = 0;
        abStack_8c[5] = 0;
        abStack_8c[6] = (byte)((uint)local_60 >> 8);
        abStack_8c[7] = (char)local_60;
        abStack_8c[8] = 0;
        abStack_8c[9] = 0;
        abStack_8c[10] = (byte)((uint)h >> 8);
        abStack_8c[0xb] = (char)h;
        abStack_8c[0xc] = 8;
        uStack_7f = (uint)(byte)""[local_5c];
        bStack_7b = 0;
        uStack_7a = 0;
        uStack_78 = 0;
        uStack_77 = (undefined1)(sVar6 >> 0x18);
        uStack_76 = (undefined1)(sVar6 >> 0x10);
        uStack_75 = (undefined1)(sVar6 >> 8);
        uStack_74 = (undefined1)sVar6;
        uStack_73 = 0x54414449;
        uVar12 = 0xffffffff;
        lVar8 = -0x11;
        do {
          uVar12 = uVar12 >> 4 ^ mz_crc32::s_crc32[(uVar12 ^ (&bStack_7b)[lVar8]) & 0xf];
          uVar12 = uVar12 >> 4 ^ mz_crc32::s_crc32[(uint)((&bStack_7b)[lVar8] >> 4) ^ uVar12 & 0xf];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        uVar12 = ~uVar12;
        lVar8 = 0x1d;
        do {
          *(char *)((long)&local_98 + lVar8) = (char)(uVar12 >> 0x18);
          uVar12 = uVar12 << 8;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x21);
        *(ulong *)((long)local_48->m_max_probes + 5) =
             CONCAT17(uStack_78,CONCAT25(uStack_7a,CONCAT14(bStack_7b,uStack_7f)));
        *(ulong *)((long)&local_48->m_adler32 + 1) =
             CONCAT44(0x54414449,
                      CONCAT13(uStack_74,CONCAT12(uStack_75,CONCAT11(uStack_76,uStack_77))));
        iVar1 = (uint6)CONCAT11((char)local_60,abStack_8c[6]) << 0x10;
        local_48->m_flags = (int)iVar1;
        local_48->m_max_probes[0] = (int)(CONCAT17((char)h,CONCAT16(abStack_8c[10],iVar1)) >> 0x20);
        *(ulong *)(local_48->m_max_probes + 1) =
             CONCAT26(uStack_7a,CONCAT15(bStack_7b,CONCAT41(uStack_7f,8)));
        local_48->m_pPut_buf_func = (tdefl_put_buf_func_ptr)0xa1a0a0d474e5089;
        local_48->m_pPut_buf_user = (void *)0x524448490d000000;
        mVar5 = tdefl_output_buffer_putter("",0x10,&local_58);
        if (mVar5 != 0) {
          lVar8 = 0;
          mVar7 = mz_crc32(0,(mz_uint8 *)((long)&local_48->m_lookahead_pos + 1),*psVar2 + 4);
          do {
            *(char *)((long)local_48->m_max_probes + lVar8 + local_58 + -0x24) =
                 (char)(mVar7 >> 0x18);
            lVar8 = lVar8 + 1;
            mVar7 = (mz_ulong)(uint)((int)mVar7 << 8);
          } while (lVar8 != 4);
          *psVar2 = *psVar2 + 0x39;
          crnlib::crnlib_free(d);
          return local_48;
        }
        *psVar2 = 0;
      }
      crnlib::crnlib_free(d);
      d = local_48;
    }
    crnlib::crnlib_free(d);
  }
  return (void *)0x0;
}

Assistant:

void* tdefl_write_image_to_png_file_in_memory(const void* pImage, int w, int h, int num_chans, size_t* pLen_out) {
  tdefl_compressor* pComp = (tdefl_compressor*)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  // write dummy header
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, TDEFL_DEFAULT_MAX_PROBES | TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp, (mz_uint8*)pImage + y * bpl, bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  // write real header
  *pLen_out = out_buf.m_size - 41;
  {
    mz_uint8 pnghdr[41] = {0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00, 0x00, 0x00, 0x0d, 0x49, 0x48, 0x44, 0x52,
                           0, 0, (mz_uint8)(w >> 8), (mz_uint8)w, 0, 0, (mz_uint8)(h >> 8), (mz_uint8)h, 8, (mz_uint8)"\0\0\04\02\06"[num_chans], 0, 0, 0, 0, 0, 0, 0,
                           (mz_uint8)(*pLen_out >> 24), (mz_uint8)(*pLen_out >> 16), (mz_uint8)(*pLen_out >> 8), (mz_uint8)*pLen_out, 0x49, 0x44, 0x41, 0x54};
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8*)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4, *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}